

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.c
# Opt level: O0

void xmlCompilePathPattern(xmlPatParserContextPtr ctxt)

{
  int iVar1;
  bool bVar2;
  xmlPatParserContextPtr ctxt_local;
  
  while( true ) {
    bVar2 = true;
    if ((*ctxt->cur != ' ') && ((*ctxt->cur < 9 || (bVar2 = true, 10 < *ctxt->cur)))) {
      bVar2 = *ctxt->cur == '\r';
    }
    if (!bVar2) break;
    if (*ctxt->cur != '\0') {
      ctxt->cur = ctxt->cur + 1;
    }
  }
  if (*ctxt->cur == '/') {
    ctxt->comp->flags = ctxt->comp->flags | 0x100;
  }
  else if ((*ctxt->cur == '.') || ((ctxt->comp->flags & 7U) != 0)) {
    ctxt->comp->flags = ctxt->comp->flags | 0x200;
  }
  if ((*ctxt->cur == '/') && (ctxt->cur[1] == '/')) {
    iVar1 = xmlPatternAdd(ctxt,ctxt->comp,XML_OP_ANCESTOR,(xmlChar *)0x0,(xmlChar *)0x0);
    if (iVar1 != 0) {
      return;
    }
    if (*ctxt->cur != '\0') {
      ctxt->cur = ctxt->cur + 1;
    }
    if (*ctxt->cur != '\0') {
      ctxt->cur = ctxt->cur + 1;
    }
  }
  else if ((*ctxt->cur == '.') && ((ctxt->cur[1] == '/' && (ctxt->cur[2] == '/')))) {
    iVar1 = xmlPatternAdd(ctxt,ctxt->comp,XML_OP_ANCESTOR,(xmlChar *)0x0,(xmlChar *)0x0);
    if (iVar1 != 0) {
      return;
    }
    if (*ctxt->cur != '\0') {
      ctxt->cur = ctxt->cur + 1;
    }
    if (*ctxt->cur != '\0') {
      ctxt->cur = ctxt->cur + 1;
    }
    if (*ctxt->cur != '\0') {
      ctxt->cur = ctxt->cur + 1;
    }
    while( true ) {
      bVar2 = true;
      if ((*ctxt->cur != ' ') && ((*ctxt->cur < 9 || (bVar2 = true, 10 < *ctxt->cur)))) {
        bVar2 = *ctxt->cur == '\r';
      }
      if (!bVar2) break;
      if (*ctxt->cur != '\0') {
        ctxt->cur = ctxt->cur + 1;
      }
    }
    if (*ctxt->cur == '\0') {
      ctxt->error = 1;
      return;
    }
  }
  if (*ctxt->cur != '@') {
    if (*ctxt->cur == '/') {
      iVar1 = xmlPatternAdd(ctxt,ctxt->comp,XML_OP_ROOT,(xmlChar *)0x0,(xmlChar *)0x0);
      if (iVar1 != 0) {
        return;
      }
      if (*ctxt->cur != '\0') {
        ctxt->cur = ctxt->cur + 1;
      }
      while( true ) {
        bVar2 = true;
        if ((*ctxt->cur != ' ') && ((*ctxt->cur < 9 || (bVar2 = true, 10 < *ctxt->cur)))) {
          bVar2 = *ctxt->cur == '\r';
        }
        if (!bVar2) break;
        if (*ctxt->cur != '\0') {
          ctxt->cur = ctxt->cur + 1;
        }
      }
      if (*ctxt->cur == '\0') {
        ctxt->error = 1;
        return;
      }
    }
    xmlCompileStepPattern(ctxt);
    if (ctxt->error == 0) {
      while( true ) {
        bVar2 = true;
        if ((*ctxt->cur != ' ') && ((*ctxt->cur < 9 || (bVar2 = true, 10 < *ctxt->cur)))) {
          bVar2 = *ctxt->cur == '\r';
        }
        if (!bVar2) break;
        if (*ctxt->cur != '\0') {
          ctxt->cur = ctxt->cur + 1;
        }
      }
      do {
        while( true ) {
          if (*ctxt->cur != '/') goto LAB_001a3105;
          if (ctxt->cur[1] != '/') break;
          iVar1 = xmlPatternAdd(ctxt,ctxt->comp,XML_OP_ANCESTOR,(xmlChar *)0x0,(xmlChar *)0x0);
          if (iVar1 != 0) {
            return;
          }
          if (*ctxt->cur != '\0') {
            ctxt->cur = ctxt->cur + 1;
          }
          if (*ctxt->cur != '\0') {
            ctxt->cur = ctxt->cur + 1;
          }
          while( true ) {
            bVar2 = true;
            if ((*ctxt->cur != ' ') && ((*ctxt->cur < 9 || (bVar2 = true, 10 < *ctxt->cur)))) {
              bVar2 = *ctxt->cur == '\r';
            }
            if (!bVar2) break;
            if (*ctxt->cur != '\0') {
              ctxt->cur = ctxt->cur + 1;
            }
          }
          xmlCompileStepPattern(ctxt);
          if (ctxt->error != 0) {
            return;
          }
        }
        iVar1 = xmlPatternAdd(ctxt,ctxt->comp,XML_OP_PARENT,(xmlChar *)0x0,(xmlChar *)0x0);
        if (iVar1 != 0) {
          return;
        }
        if (*ctxt->cur != '\0') {
          ctxt->cur = ctxt->cur + 1;
        }
        while( true ) {
          bVar2 = true;
          if ((*ctxt->cur != ' ') && ((*ctxt->cur < 9 || (bVar2 = true, 10 < *ctxt->cur)))) {
            bVar2 = *ctxt->cur == '\r';
          }
          if (!bVar2) break;
          if (*ctxt->cur != '\0') {
            ctxt->cur = ctxt->cur + 1;
          }
        }
        if (*ctxt->cur == '\0') {
          ctxt->error = 1;
          return;
        }
        xmlCompileStepPattern(ctxt);
      } while (ctxt->error == 0);
    }
    return;
  }
  if (*ctxt->cur != '\0') {
    ctxt->cur = ctxt->cur + 1;
  }
  xmlCompileAttributeTest(ctxt);
  if (ctxt->error != 0) {
    return;
  }
  while( true ) {
    bVar2 = true;
    if ((*ctxt->cur != ' ') && ((*ctxt->cur < 9 || (bVar2 = true, 10 < *ctxt->cur)))) {
      bVar2 = *ctxt->cur == '\r';
    }
    if (!bVar2) break;
    if (*ctxt->cur != '\0') {
      ctxt->cur = ctxt->cur + 1;
    }
  }
  if ((*ctxt->cur != '\0') && (xmlCompileStepPattern(ctxt), ctxt->error != 0)) {
    return;
  }
LAB_001a3105:
  if (*ctxt->cur == '\0') {
    return;
  }
  ctxt->error = 1;
  return;
}

Assistant:

static void
xmlCompilePathPattern(xmlPatParserContextPtr ctxt) {
    SKIP_BLANKS;
    if (CUR == '/') {
        ctxt->comp->flags |= PAT_FROM_ROOT;
    } else if ((CUR == '.') || (ctxt->comp->flags & XML_PATTERN_NOTPATTERN)) {
        ctxt->comp->flags |= PAT_FROM_CUR;
    }

    if ((CUR == '/') && (NXT(1) == '/')) {
	PUSH(XML_OP_ANCESTOR, NULL, NULL);
	NEXT;
	NEXT;
    } else if ((CUR == '.') && (NXT(1) == '/') && (NXT(2) == '/')) {
	PUSH(XML_OP_ANCESTOR, NULL, NULL);
	NEXT;
	NEXT;
	NEXT;
	/* Check for incompleteness. */
	SKIP_BLANKS;
	if (CUR == 0) {
	    ERROR5(NULL, NULL, NULL,
	       "Incomplete expression '%s'.\n", ctxt->base);
	    ctxt->error = 1;
	    goto error;
	}
    }
    if (CUR == '@') {
	NEXT;
	xmlCompileAttributeTest(ctxt);
        if (ctxt->error != 0)
            goto error;
	SKIP_BLANKS;
	/* TODO: check for incompleteness */
	if (CUR != 0) {
	    xmlCompileStepPattern(ctxt);
	    if (ctxt->error != 0)
		goto error;
	}
    } else {
        if (CUR == '/') {
	    PUSH(XML_OP_ROOT, NULL, NULL);
	    NEXT;
	    /* Check for incompleteness. */
	    SKIP_BLANKS;
	    if (CUR == 0) {
		ERROR5(NULL, NULL, NULL,
		    "Incomplete expression '%s'.\n", ctxt->base);
		ctxt->error = 1;
		goto error;
	    }
	}
	xmlCompileStepPattern(ctxt);
	if (ctxt->error != 0)
	    goto error;
	SKIP_BLANKS;
	while (CUR == '/') {
	    if (NXT(1) == '/') {
	        PUSH(XML_OP_ANCESTOR, NULL, NULL);
		NEXT;
		NEXT;
		SKIP_BLANKS;
		xmlCompileStepPattern(ctxt);
		if (ctxt->error != 0)
		    goto error;
	    } else {
	        PUSH(XML_OP_PARENT, NULL, NULL);
		NEXT;
		SKIP_BLANKS;
		if (CUR == 0) {
		    ERROR5(NULL, NULL, NULL,
		    "Incomplete expression '%s'.\n", ctxt->base);
		    ctxt->error = 1;
		    goto error;
		}
		xmlCompileStepPattern(ctxt);
		if (ctxt->error != 0)
		    goto error;
	    }
	}
    }
    if (CUR != 0) {
	ERROR5(NULL, NULL, NULL,
	       "Failed to compile pattern %s\n", ctxt->base);
	ctxt->error = 1;
    }
error:
    return;
}